

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_doc * duckdb_yyjson::yyjson_mut_doc_mut_copy(yyjson_mut_doc *doc,yyjson_alc *alc)

{
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  yyjson_mut_doc *m_doc;
  yyjson_mut_val *pyVar4;
  yyjson_mut_doc *doc_1;
  undefined **ppuVar5;
  
  if (doc != (yyjson_mut_doc *)0x0) {
    pyVar4 = doc->root;
    ppuVar5 = &YYJSON_DEFAULT_ALC;
    if (alc != (yyjson_alc *)0x0) {
      ppuVar5 = &alc->malloc;
    }
    m_doc = (yyjson_mut_doc *)(*((yyjson_alc *)ppuVar5)->malloc)(((yyjson_alc *)ppuVar5)->ctx,0x78);
    if (pyVar4 == (yyjson_mut_val *)0x0) {
      if (m_doc != (yyjson_mut_doc *)0x0) {
        (m_doc->val_pool).chunk_size = 0;
        (m_doc->val_pool).chunk_size_max = 0;
        (m_doc->val_pool).cur = (yyjson_mut_val *)0x0;
        (m_doc->val_pool).end = (yyjson_mut_val *)0x0;
        (m_doc->str_pool).chunk_size_max = 0;
        (m_doc->str_pool).chunks = (yyjson_str_chunk *)0x0;
        (m_doc->str_pool).end = (char *)0x0;
        (m_doc->str_pool).chunk_size = 0;
        (m_doc->alc).ctx = (void *)0x0;
        (m_doc->str_pool).cur = (char *)0x0;
        (m_doc->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (m_doc->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        m_doc->root = (yyjson_mut_val *)0x0;
        (m_doc->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (m_doc->val_pool).chunks = (yyjson_val_chunk *)0x0;
        p_Var1 = ((yyjson_alc *)ppuVar5)->realloc;
        p_Var2 = ((yyjson_alc *)ppuVar5)->free;
        pvVar3 = ((yyjson_alc *)ppuVar5)->ctx;
        (m_doc->alc).malloc = ((yyjson_alc *)ppuVar5)->malloc;
        (m_doc->alc).realloc = p_Var1;
        (m_doc->alc).free = p_Var2;
        (m_doc->alc).ctx = pvVar3;
        (m_doc->str_pool).chunk_size = 0x100;
        (m_doc->str_pool).chunk_size_max = 0x10000000;
        (m_doc->val_pool).chunk_size = 0x180;
        (m_doc->val_pool).chunk_size_max = 0x18000000;
        return m_doc;
      }
    }
    else {
      if (m_doc == (yyjson_mut_doc *)0x0) {
        m_doc = (yyjson_mut_doc *)0x0;
      }
      else {
        (m_doc->val_pool).chunk_size = 0;
        (m_doc->val_pool).chunk_size_max = 0;
        (m_doc->val_pool).cur = (yyjson_mut_val *)0x0;
        (m_doc->val_pool).end = (yyjson_mut_val *)0x0;
        (m_doc->str_pool).chunk_size_max = 0;
        (m_doc->str_pool).chunks = (yyjson_str_chunk *)0x0;
        (m_doc->str_pool).end = (char *)0x0;
        (m_doc->str_pool).chunk_size = 0;
        (m_doc->alc).ctx = (void *)0x0;
        (m_doc->str_pool).cur = (char *)0x0;
        (m_doc->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (m_doc->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        m_doc->root = (yyjson_mut_val *)0x0;
        (m_doc->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (m_doc->val_pool).chunks = (yyjson_val_chunk *)0x0;
        p_Var1 = ((yyjson_alc *)ppuVar5)->realloc;
        p_Var2 = ((yyjson_alc *)ppuVar5)->free;
        pvVar3 = ((yyjson_alc *)ppuVar5)->ctx;
        (m_doc->alc).malloc = ((yyjson_alc *)ppuVar5)->malloc;
        (m_doc->alc).realloc = p_Var1;
        (m_doc->alc).free = p_Var2;
        (m_doc->alc).ctx = pvVar3;
        (m_doc->str_pool).chunk_size = 0x100;
        (m_doc->str_pool).chunk_size_max = 0x10000000;
        (m_doc->val_pool).chunk_size = 0x180;
        (m_doc->val_pool).chunk_size_max = 0x18000000;
      }
      if (m_doc != (yyjson_mut_doc *)0x0) {
        if (doc->root == (yyjson_mut_val *)0x0) {
          pyVar4 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar4 = unsafe_yyjson_mut_val_mut_copy(m_doc,doc->root);
        }
        if (pyVar4 != (yyjson_mut_val *)0x0) {
          m_doc->root = pyVar4;
          return m_doc;
        }
        yyjson_mut_doc_free(m_doc);
      }
    }
  }
  return (yyjson_mut_doc *)0x0;
}

Assistant:

yyjson_mut_doc *yyjson_mut_doc_mut_copy(yyjson_mut_doc *doc,
                                        const yyjson_alc *alc) {
    yyjson_mut_doc *m_doc;
    yyjson_mut_val *m_val;

    if (!doc) return NULL;
    if (!doc->root) return yyjson_mut_doc_new(alc);

    m_doc = yyjson_mut_doc_new(alc);
    if (!m_doc) return NULL;
    m_val = yyjson_mut_val_mut_copy(m_doc, doc->root);
    if (!m_val) {
        yyjson_mut_doc_free(m_doc);
        return NULL;
    }
    yyjson_mut_doc_set_root(m_doc, m_val);
    return m_doc;
}